

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Extractor::extract(Extractor *this,int blob_index,Mat *feat,int type)

{
  int iVar1;
  NetPrivate *this_00;
  int time_ms;
  int flush_denormals;
  int iVar2;
  ExtractorPrivate *pEVar3;
  pointer pMVar4;
  void *in_R8;
  Mat bottom_blob_unpacked;
  
  if (blob_index < 0) {
    return -1;
  }
  if ((int)(((long)(this->d->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->d->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x48) <= blob_index) {
    return -1;
  }
  time_ms = get_kmp_blocktime();
  set_kmp_blocktime((this->d->opt).openmp_blocktime);
  flush_denormals = get_flush_denormals();
  set_flush_denormals((this->d->opt).flush_denormals);
  pEVar3 = this->d;
  pMVar4 = (pEVar3->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = 0;
  if (pMVar4[(uint)blob_index].dims == 0) {
    this_00 = pEVar3->net->d;
    iVar2 = (this_00->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
            super__Vector_impl_data._M_start[(uint)blob_index].producer;
    if ((pEVar3->opt).use_local_pool_allocator == true) {
      if ((pEVar3->opt).blob_allocator == (Allocator *)0x0) {
        (pEVar3->opt).blob_allocator = &this_00->local_blob_allocator->super_Allocator;
      }
      if ((pEVar3->opt).workspace_allocator == (Allocator *)0x0) {
        (pEVar3->opt).workspace_allocator = &this_00->local_workspace_allocator->super_Allocator;
      }
    }
    iVar2 = NetPrivate::forward_layer(this_00,iVar2,&pEVar3->blob_mats,&pEVar3->opt);
    pMVar4 = (this->d->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  Mat::operator=(feat,pMVar4 + (uint)blob_index);
  pEVar3 = this->d;
  if (((type == 0) && ((pEVar3->opt).use_packing_layout != false)) && (feat->elempack != 1)) {
    bottom_blob_unpacked.cstep = 0;
    bottom_blob_unpacked.data = (void *)0x0;
    bottom_blob_unpacked.refcount._0_4_ = 0;
    bottom_blob_unpacked.refcount._4_4_ = 0;
    bottom_blob_unpacked.elemsize._0_4_ = 0;
    bottom_blob_unpacked._20_8_ = 0;
    bottom_blob_unpacked.allocator = (Allocator *)0x0;
    bottom_blob_unpacked.dims = 0;
    bottom_blob_unpacked.w = 0;
    bottom_blob_unpacked.h = 0;
    bottom_blob_unpacked.d = 0;
    bottom_blob_unpacked.c = 0;
    convert_packing(feat,&bottom_blob_unpacked,1,&pEVar3->opt);
    Mat::operator=(feat,&bottom_blob_unpacked);
    Mat::~Mat(&bottom_blob_unpacked);
    pEVar3 = this->d;
  }
  iVar1 = feat->elempack;
  if ((type == 0) && ((pEVar3->opt).use_bf16_storage != false)) {
    if ((iVar1 == 0) || (((int)feat->elemsize << 3) / iVar1 != 0x10)) goto LAB_001453a4;
    bottom_blob_unpacked.cstep = 0;
    bottom_blob_unpacked.data = (void *)0x0;
    bottom_blob_unpacked.refcount._0_4_ = 0;
    bottom_blob_unpacked.refcount._4_4_ = 0;
    bottom_blob_unpacked.elemsize._0_4_ = 0;
    bottom_blob_unpacked._20_8_ = 0;
    bottom_blob_unpacked.allocator = (Allocator *)0x0;
    bottom_blob_unpacked.dims = 0;
    bottom_blob_unpacked.w = 0;
    bottom_blob_unpacked.h = 0;
    bottom_blob_unpacked.d = 0;
    bottom_blob_unpacked.c = 0;
    cast_bfloat16_to_float32(feat,&bottom_blob_unpacked,&pEVar3->opt);
    Mat::operator=(feat,&bottom_blob_unpacked);
  }
  else {
    if ((iVar1 == 0) || ((type != 0 || (((int)feat->elemsize << 3) / iVar1 != 8))))
    goto LAB_001453a4;
    bottom_blob_unpacked.cstep = 0;
    bottom_blob_unpacked.data = (void *)0x0;
    bottom_blob_unpacked.refcount._0_4_ = 0;
    bottom_blob_unpacked.refcount._4_4_ = 0;
    bottom_blob_unpacked.elemsize._0_4_ = 0;
    bottom_blob_unpacked._20_8_ = 0;
    bottom_blob_unpacked.allocator = (Allocator *)0x0;
    bottom_blob_unpacked.dims = 0;
    bottom_blob_unpacked.w = 0;
    bottom_blob_unpacked.h = 0;
    bottom_blob_unpacked.d = 0;
    bottom_blob_unpacked.c = 0;
    cast_int8_to_float32(feat,&bottom_blob_unpacked,&pEVar3->opt);
    Mat::operator=(feat,&bottom_blob_unpacked);
  }
  Mat::~Mat(&bottom_blob_unpacked);
LAB_001453a4:
  if (((this->d->opt).use_local_pool_allocator == true) &&
     ((PoolAllocator *)feat->allocator == this->d->net->d->local_blob_allocator)) {
    Mat::clone(&bottom_blob_unpacked,(__fn *)feat,(void *)0x0,(int)(PoolAllocator *)feat->allocator,
               in_R8);
    Mat::operator=(feat,&bottom_blob_unpacked);
    Mat::~Mat(&bottom_blob_unpacked);
  }
  set_kmp_blocktime(time_ms);
  set_flush_denormals(flush_denormals);
  return iVar2;
}

Assistant:

int Extractor::extract(int blob_index, Mat& feat, int type)
{
    if (blob_index < 0 || blob_index >= (int)d->blob_mats.size())
        return -1;

    int old_blocktime = get_kmp_blocktime();
    set_kmp_blocktime(d->opt.openmp_blocktime);

    int old_flush_denormals = get_flush_denormals();
    set_flush_denormals(d->opt.flush_denormals);

    int ret = 0;

    if (d->blob_mats[blob_index].dims == 0)
    {
        int layer_index = d->net->blobs()[blob_index].producer;

        // use local allocator
        if (d->opt.use_local_pool_allocator)
        {
            if (!d->opt.blob_allocator)
            {
                d->opt.blob_allocator = d->net->d->local_blob_allocator;
            }
            if (!d->opt.workspace_allocator)
            {
                d->opt.workspace_allocator = d->net->d->local_workspace_allocator;
            }
        }

#if NCNN_VULKAN
        if (d->opt.use_vulkan_compute)
        {
            // use local allocator
            if (!d->opt.blob_vkallocator)
            {
                d->local_blob_vkallocator = d->net->vulkan_device()->acquire_blob_allocator();
                d->opt.blob_vkallocator = d->local_blob_vkallocator;
            }
            if (!d->opt.workspace_vkallocator)
            {
                d->opt.workspace_vkallocator = d->opt.blob_vkallocator;
            }
            if (!d->opt.staging_vkallocator)
            {
                d->local_staging_vkallocator = d->net->vulkan_device()->acquire_staging_allocator();
                d->opt.staging_vkallocator = d->local_staging_vkallocator;
            }

            ncnn::VkCompute cmd(d->net->vulkan_device());
#if NCNN_BENCHMARK
            cmd.create_query_pool(d->net->layers().size() * 2);
#endif // NCNN_BENCHMARK

            // TODO vkimagemat for adreno
            if (d->opt.use_image_storage)
            {
                VkImageMat feat_gpu;
                ret = extract(blob_index, feat_gpu, cmd);

                if (d->blob_mats[blob_index].dims == 0 && feat_gpu.dims != 0)
                {
                    cmd.record_download(feat_gpu, d->blob_mats[blob_index], d->opt);

                    cmd.submit_and_wait();

#if NCNN_BENCHMARK
                    std::vector<uint64_t> results(d->net->layers().size() * 2);
                    cmd.get_query_pool_results(0, d->net->layers().size() * 2, results);
                    for (size_t i = 0; i < d->net->layers().size(); i++)
                    {
                        uint64_t start = results[i * 2];
                        uint64_t end = results[i * 2 + 1];
                        if (start == 0 || end == 0)
                            continue;

                        double duration_us = (end - start) * d->net->vulkan_device()->info.timestamp_period() / 1000;
                        NCNN_LOGE("%-24s %-30s %8.2lfus    |", d->net->layers()[i]->type.c_str(), d->net->layers()[i]->name.c_str(), duration_us);
                    }
#endif // NCNN_BENCHMARK
                }
            }
            else
            {
                VkMat feat_gpu;
                ret = extract(blob_index, feat_gpu, cmd);

                if (d->blob_mats[blob_index].dims == 0 && feat_gpu.dims != 0)
                {
                    cmd.record_download(feat_gpu, d->blob_mats[blob_index], d->opt);

                    cmd.submit_and_wait();

#if NCNN_BENCHMARK
                    std::vector<uint64_t> results(d->net->layers().size() * 2);
                    cmd.get_query_pool_results(0, d->net->layers().size() * 2, results);
                    for (size_t i = 0; i < d->net->layers().size(); i++)
                    {
                        uint64_t start = results[i * 2];
                        uint64_t end = results[i * 2 + 1];
                        if (start == 0 || end == 0)
                            continue;

                        double duration_us = (end - start) * d->net->vulkan_device()->info.timestamp_period() / 1000;
                        NCNN_LOGE("%-24s %-30s %8.2lfus    |", d->net->layers()[i]->type.c_str(), d->net->layers()[i]->name.c_str(), duration_us);
                    }
#endif // NCNN_BENCHMARK
                }
            }
        }
        else
        {
            ret = d->net->d->forward_layer(layer_index, d->blob_mats, d->opt);
        }
#else
        ret = d->net->d->forward_layer(layer_index, d->blob_mats, d->opt);
#endif // NCNN_VULKAN
    }

    feat = d->blob_mats[blob_index];

    if (d->opt.use_packing_layout && (type == 0) && feat.elempack != 1)
    {
        Mat bottom_blob_unpacked;
        convert_packing(feat, bottom_blob_unpacked, 1, d->opt);
        feat = bottom_blob_unpacked;
    }

    // clang-format off
    // *INDENT-OFF*
#if NCNN_ARM82
    if (d->opt.use_fp16_storage && cpu_support_arm_asimdhp() && (type == 0))
    {
        if (feat.elembits() == 16)
        {
            Mat feat_fp32;
            cast_float16_to_float32(feat, feat_fp32, d->opt);
            feat = feat_fp32;
        }
    }
    else
#endif // NCNN_ARM82
#if NCNN_BF16
    if (d->opt.use_bf16_storage && (type == 0))
    {
        if (feat.elembits() == 16)
        {
            Mat feat_fp32;
            cast_bfloat16_to_float32(feat, feat_fp32, d->opt);
            feat = feat_fp32;
        }
    }
    else
#endif // NCNN_BF16
    if (feat.elembits() == 8 && (type == 0))
    {
        Mat feat_fp32;
        cast_int8_to_float32(feat, feat_fp32, d->opt);
        feat = feat_fp32;
    }
    // *INDENT-ON*
    // clang-format on

    if (d->opt.use_local_pool_allocator && feat.allocator == d->net->d->local_blob_allocator)
    {
        // detach the returned mat from local pool allocator
        // so we could destroy net instance much earlier
        feat = feat.clone();
    }

    set_kmp_blocktime(old_blocktime);
    set_flush_denormals(old_flush_denormals);

    return ret;
}